

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_enc.c
# Opt level: O0

int PutI4Mode(VP8BitWriter *bw,int mode,uint8_t *prob)

{
  int iVar1;
  undefined8 in_RDX;
  int in_ESI;
  int bit;
  undefined4 in_stack_fffffffffffffff0;
  
  iVar1 = VP8PutBit((VP8BitWriter *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                    (int)((ulong)in_RDX >> 0x20),(int)in_RDX);
  if (((iVar1 != 0) &&
      (iVar1 = VP8PutBit((VP8BitWriter *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                         (int)((ulong)in_RDX >> 0x20),(int)in_RDX), iVar1 != 0)) &&
     (iVar1 = VP8PutBit((VP8BitWriter *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                        (int)((ulong)in_RDX >> 0x20),(int)in_RDX), iVar1 != 0)) {
    iVar1 = VP8PutBit((VP8BitWriter *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                      (int)((ulong)in_RDX >> 0x20),(int)in_RDX);
    bit = (int)((ulong)in_RDX >> 0x20);
    if (iVar1 == 0) {
      iVar1 = VP8PutBit((VP8BitWriter *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),bit,(int)in_RDX);
      if (iVar1 != 0) {
        VP8PutBit((VP8BitWriter *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                  (int)((ulong)in_RDX >> 0x20),(int)in_RDX);
      }
    }
    else {
      iVar1 = VP8PutBit((VP8BitWriter *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),bit,(int)in_RDX);
      if ((iVar1 != 0) &&
         (iVar1 = VP8PutBit((VP8BitWriter *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                            (int)((ulong)in_RDX >> 0x20),(int)in_RDX), iVar1 != 0)) {
        VP8PutBit((VP8BitWriter *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                  (int)((ulong)in_RDX >> 0x20),(int)in_RDX);
      }
    }
  }
  return in_ESI;
}

Assistant:

static int PutI4Mode(VP8BitWriter* const bw, int mode,
                     const uint8_t* const prob) {
  if (VP8PutBit(bw, mode != B_DC_PRED, prob[0])) {
    if (VP8PutBit(bw, mode != B_TM_PRED, prob[1])) {
      if (VP8PutBit(bw, mode != B_VE_PRED, prob[2])) {
        if (!VP8PutBit(bw, mode >= B_LD_PRED, prob[3])) {
          if (VP8PutBit(bw, mode != B_HE_PRED, prob[4])) {
            VP8PutBit(bw, mode != B_RD_PRED, prob[5]);
          }
        } else {
          if (VP8PutBit(bw, mode != B_LD_PRED, prob[6])) {
            if (VP8PutBit(bw, mode != B_VL_PRED, prob[7])) {
              VP8PutBit(bw, mode != B_HD_PRED, prob[8]);
            }
          }
        }
      }
    }
  }
  return mode;
}